

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O0

void * Abs_ProverThread(void *pArg)

{
  int iVar1;
  int iVar2;
  int status;
  int RetValue;
  Pdr_Par_t *pPars;
  Pdr_Par_t Pars;
  Abs_ThData_t *pThData;
  void *pArg_local;
  
  Pars.pInvFileName = (char *)pArg;
  Pdr_ManSetDefaultParams((Pdr_Par_t *)&pPars);
  Pars.fVeryVerbose = 1;
  Pars.nProveOuts = *(int *)(Pars.pInvFileName + 0xc);
  Pars._144_8_ = Abs_CallBackToStop;
  iVar1 = Pdr_ManSolve(*(Aig_Man_t **)Pars.pInvFileName,(Pdr_Par_t *)&pPars);
  if (iVar1 == 1) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
    if (iVar2 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                    ,0x6d,"void *Abs_ProverThread(void *)");
    }
    g_fAbstractionProved = 1;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar2 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                    ,0x6f,"void *Abs_ProverThread(void *)");
    }
  }
  if (*(int *)(Pars.pInvFileName + 8) != 0) {
    if (iVar1 == 1) {
      Abc_Print(1,"Proved abstraction %d.\n",(ulong)*(uint *)(Pars.pInvFileName + 0xc));
    }
    else if (iVar1 == 0) {
      Abc_Print(1,"Disproved abstraction %d.\n",(ulong)*(uint *)(Pars.pInvFileName + 0xc));
    }
    else {
      if (iVar1 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absPth.c"
                      ,0x7a,"void *Abs_ProverThread(void *)");
      }
      Abc_Print(1,"Cancelled abstraction %d.\n",(ulong)*(uint *)(Pars.pInvFileName + 0xc));
    }
  }
  Aig_ManStop(*(Aig_Man_t **)Pars.pInvFileName);
  if (Pars.pInvFileName != (char *)0x0) {
    free(Pars.pInvFileName);
    Pars.pInvFileName = (char *)0x0;
  }
  pthread_exit((void *)0x0);
}

Assistant:

void * Abs_ProverThread( void * pArg )
{
    Abs_ThData_t * pThData = (Abs_ThData_t *)pArg;
    Pdr_Par_t Pars, * pPars = &Pars;
    int RetValue, status;
    // call PDR
    Pdr_ManSetDefaultParams( pPars );
    pPars->fSilent   = 1;
    pPars->RunId     = pThData->RunId;
    pPars->pFuncStop = Abs_CallBackToStop;
    RetValue = Pdr_ManSolve( pThData->pAig, pPars );
    // update the result
    if ( RetValue == 1 )
    {
        status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
        g_fAbstractionProved = 1;
        status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    }
    // quit this thread
    if ( pThData->fVerbose )
    {
        if ( RetValue == 1 )
            Abc_Print( 1, "Proved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == 0 )
            Abc_Print( 1, "Disproved abstraction %d.\n", pThData->RunId );
        else if ( RetValue == -1 )
            Abc_Print( 1, "Cancelled abstraction %d.\n", pThData->RunId );
        else assert( 0 );
    }
    // free memory
    Aig_ManStop( pThData->pAig );
    ABC_FREE( pThData );
    // quit this thread
    pthread_exit( NULL );
    assert(0);
    return NULL;
}